

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

UnicodeString * icu_63::appendAsciiDigits(int32_t number,uint8_t length,UnicodeString *str)

{
  int iVar1;
  bool bVar2;
  uint local_50;
  uint local_4c;
  int iStack_48;
  int32_t i;
  int32_t digits [10];
  UBool negative;
  UnicodeString *str_local;
  uint8_t length_local;
  int32_t number_local;
  
  digits[9]._3_1_ = 0;
  bVar2 = number < 0;
  str_local._4_4_ = number;
  if (bVar2) {
    digits[9]._3_1_ = 1;
    str_local._4_4_ = -number;
  }
  if (length < 0xb) {
    local_50 = (uint)length;
  }
  else {
    local_50 = 10;
  }
  str_local._3_1_ = (byte)local_50;
  digits[9]._3_1_ = bVar2;
  if (str_local._3_1_ == 0) {
    local_4c = 0;
    do {
      iVar1 = local_4c + 1;
      (&iStack_48)[(int)local_4c] = str_local._4_4_ % 10;
      str_local._4_4_ = str_local._4_4_ / 10;
      local_4c = iVar1;
    } while (str_local._4_4_ != 0);
    str_local._3_1_ = (byte)iVar1;
  }
  else {
    for (local_4c = 0; (int)local_4c < (int)local_50; local_4c = local_4c + 1) {
      (&iStack_48)[(int)local_4c] = str_local._4_4_ % 10;
      str_local._4_4_ = str_local._4_4_ / 10;
    }
  }
  if (digits[9]._3_1_ != '\0') {
    UnicodeString::append(str,L'-');
  }
  local_4c = (uint)str_local._3_1_;
  while (local_4c = local_4c - 1, -1 < (int)local_4c) {
    UnicodeString::append(str,(short)(&iStack_48)[(int)local_4c] + L'0');
  }
  return str;
}

Assistant:

static UnicodeString& appendAsciiDigits(int32_t number, uint8_t length, UnicodeString& str) {
    UBool negative = FALSE;
    int32_t digits[10]; // max int32_t is 10 decimal digits
    int32_t i;

    if (number < 0) {
        negative = TRUE;
        number *= -1;
    }

    length = length > 10 ? 10 : length;
    if (length == 0) {
        // variable length
        i = 0;
        do {
            digits[i++] = number % 10;
            number /= 10;
        } while (number != 0);
        length = static_cast<uint8_t>(i);
    } else {
        // fixed digits
        for (i = 0; i < length; i++) {
           digits[i] = number % 10;
           number /= 10;
        }
    }
    if (negative) {
        str.append(MINUS);
    }
    for (i = length - 1; i >= 0; i--) {
        str.append((UChar)(digits[i] + 0x0030));
    }
    return str;
}